

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O3

void __thiscall
wasm::BranchUtils::BranchTargets::BranchTargets(BranchTargets *this,Expression *expr)

{
  _Rb_tree_header *p_Var1;
  Expression *local_20;
  Expression *expr_local;
  
  (this->inner).
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .replacep = (Expression **)0x0;
  (this->inner).
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .stack.usedFixed = 0;
  (this->inner).
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->inner).
           super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           .
           super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->inner).
           super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           .
           super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->inner).
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .currFunction = (Function *)0x0;
  (this->inner).
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .currModule = (Module *)0x0;
  p_Var1 = &(this->inner).targets._M_t._M_impl.super__Rb_tree_header;
  (this->inner).targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inner).targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inner).targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->inner).targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->inner).targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->inner).branches._M_t._M_impl.super__Rb_tree_header;
  (this->inner).branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inner).branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inner).branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->inner).branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->inner).branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_20 = expr;
  Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ::walk((Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
          *)this,&local_20);
  return;
}

Assistant:

BranchTargets(Expression* expr) { inner.walk(expr); }